

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O1

void deqp::RobustBufferAccessBehavior::Texture::GetData
               (Functions *gl,GLuint id,GLint level,GLuint width,GLuint height,GLenum format,
               GLenum type,GLvoid *out_data)

{
  GLenum GVar1;
  GLuint local_34;
  
  (*gl->genFramebuffers)(1,&local_34);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"GenFramebuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x2f7);
  (*gl->bindFramebuffer)(0x8d40,local_34);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"BindFramebuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x2f9);
  (*gl->framebufferTexture2D)(0x8d40,0x8ce0,0xde1,id,level);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"FramebufferTexture2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x2fb);
  (*gl->readPixels)(0,0,width,height,format,type,out_data);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"ReadPixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x2fe);
  (*gl->bindFramebuffer)(0x8d40,0);
  return;
}

Assistant:

void Texture::GetData(const glw::Functions& gl, glw::GLuint id, glw::GLint level, glw::GLuint width, glw::GLuint height,
					  glw::GLenum format, glw::GLenum type, glw::GLvoid* out_data)
{
	GLuint fbo;
	gl.genFramebuffers(1, &fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenFramebuffers");
	gl.bindFramebuffer(GL_FRAMEBUFFER, fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindFramebuffer");
	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, id, level);
	GLU_EXPECT_NO_ERROR(gl.getError(), "FramebufferTexture2D");

	gl.readPixels(0, 0, width, height, format, type, out_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ReadPixels");

	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
}